

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateCommandVoid1Return
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,bool definition,size_t returnParam,
          bool raii)

{
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *params;
  pointer pPVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_02;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_03;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_04;
  vector<unsigned_long,_std::allocator<unsigned_long>_> returnParams_05;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_00;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_01;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_02;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_03;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_04;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_05;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams_06;
  bool bVar2;
  __type_conflict _Var3;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  undefined7 in_register_00000089;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_01;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_04;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_05;
  initializer_list<unsigned_long> __l_06;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_07;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_08;
  initializer_list<unsigned_long> __l_09;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_10;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_11;
  initializer_list<unsigned_long> __l_12;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_13;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_14;
  initializer_list<unsigned_long> __l_15;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_16;
  initializer_list<Flags<CommandFlavourFlagBits>_> __l_17;
  undefined8 uVar4;
  undefined6 in_stack_fffffffffffffd48;
  Flags<CommandFlavourFlagBits> in_stack_fffffffffffffd4e;
  Flags<CommandFlavourFlagBits> FVar5;
  allocator_type in_stack_fffffffffffffd4f;
  Flags<CommandFlavourFlagBits> in_stack_fffffffffffffd50;
  undefined2 local_2ae;
  undefined4 local_2ac;
  string *__lhs;
  Flags<CommandFlavourFlagBits> in_stack_fffffffffffffd68;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
  *in_stack_fffffffffffffd70;
  size_t local_280;
  vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
  flavourFlags;
  map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  vectorParams;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_228;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_210;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1f8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1e0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1c8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1b0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_198;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_180;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_150;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_120;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_f0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_c0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_90;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  local_60;
  
  local_2ac = (undefined4)CONCAT71(in_register_00000089,definition);
  params = &commandData->params;
  determineVectorParams(&vectorParams,this,params);
  bVar2 = std::operator==(&(commandData->params).
                           super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                           ._M_impl.super__Vector_impl_data._M_start[returnParam].type.type,"void");
  if (bVar2) {
    if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      local_280 = returnParam;
      __l_06._M_len = 1;
      __l_06._M_array = &local_280;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1b0,__l_06,
                 (allocator_type *)&local_2ae);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::_Rb_tree(&local_60,&vectorParams._M_t);
      __l_07._M_len = 1;
      __l_07._M_array = (iterator)&stack0xfffffffffffffd50;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector(&flavourFlags,__l_07,(allocator_type *)&stack0xfffffffffffffd4f);
      FVar5.m_mask = '\x01';
      uVar4 = 0x141cb3;
      __l_08._M_len = 1;
      __l_08._M_array = (iterator)&stack0xfffffffffffffd4e;
      std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
              *)&stack0xfffffffffffffd68,__l_08,(allocator_type *)&stack0xfffffffffffffd4d);
      returnParams_02.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_60;
      returnParams_02.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_1b0;
      returnParams_02.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vectorParams_03._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)&stack0xfffffffffffffd68;
      vectorParams_03._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flavourFlags));
      vectorParams_03._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar4;
      vectorParams_03._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ =
           in_stack_fffffffffffffd48;
      vectorParams_03._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = FVar5.m_mask;
      vectorParams_03._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
           in_stack_fffffffffffffd4f;
      generateCommandSetInclusive
                (__return_storage_ptr__,this,name,commandData,initialSkipCount,local_2ac._0_1_,
                 returnParams_02,vectorParams_03,true,
                 (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)name,SUB81(initialSkipCount,0),(bool)in_stack_fffffffffffffd68.m_mask,
                 in_stack_fffffffffffffd70);
      std::
      _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      ~_Vector_base((_Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                     *)&stack0xfffffffffffffd68);
      std::
      _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
      ~_Vector_base(&flavourFlags.
                     super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                   );
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
      ::~_Rb_tree(&local_60);
      this_00 = &local_1b0;
      goto LAB_00141d1d;
    }
    if ((vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) &&
       (*(size_t *)(vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1) ==
        returnParam)) {
      __lhs = name;
      stripPluralS((string *)&flavourFlags,this,name);
      _Var3 = std::operator==(name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&flavourFlags);
      std::__cxx11::string::~string((string *)&flavourFlags);
      if (_Var3) {
        flavourFlags.
        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        flavourFlags.
        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        flavourFlags.
        super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar2 = std::operator==(__lhs,"vkGetDescriptorEXT");
        if (bVar2) {
          std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>::
          emplace_back<Flags<CommandFlavourFlagBits>>
                    ((vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
                      *)&flavourFlags,(Flags<CommandFlavourFlagBits> *)&stack0xfffffffffffffd68);
        }
        std::vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>::
        emplace_back<Flags<CommandFlavourFlagBits>>
                  ((vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
                    *)&flavourFlags,(Flags<CommandFlavourFlagBits> *)&stack0xfffffffffffffd68);
        __l._M_len = 1;
        __l._M_array = (iterator)&stack0xfffffffffffffd68;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_198,__l,
                   (allocator_type *)&local_280);
        FVar5.m_mask = (MaskType)returnParam;
        uVar4 = 0x1419d4;
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::_Rb_tree(&local_90,&vectorParams._M_t);
        returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_90;
        returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_198;
        returnParams.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&flavourFlags;
        vectorParams_00._M_t._M_impl._0_24_ =
             ZEXT924(CONCAT18(raii,(vector<Flags<CommandFlavourFlagBits>,std::allocator<Flags<CommandFlavourFlagBits>>>
                                    *)&flavourFlags));
        vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar4;
        vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ =
             in_stack_fffffffffffffd48;
        vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ =
             in_stack_fffffffffffffd4e.m_mask;
        vectorParams_00._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
             in_stack_fffffffffffffd4f;
        generateCommandSetInclusive
                  (__return_storage_ptr__,this,__lhs,commandData,initialSkipCount,local_2ac._0_1_,
                   returnParams,vectorParams_00,(bool)in_stack_fffffffffffffd50.m_mask,
                   (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    *)__lhs,SUB81(initialSkipCount,0),(bool)FVar5.m_mask,in_stack_fffffffffffffd70);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::~_Rb_tree(&local_90);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_198);
        std::
        _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::~_Vector_base(&flavourFlags.
                         super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                       );
        goto LAB_0014209f;
      }
    }
  }
  else {
    bVar2 = isHandleType(this,&(params->
                               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                               )._M_impl.super__Vector_impl_data._M_start[returnParam].type.type);
    if (bVar2) {
      if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        local_280 = returnParam;
        __l_00._M_len = 1;
        __l_00._M_array = &local_280;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1c8,__l_00,
                   (allocator_type *)&local_2ae);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::_Rb_tree(&local_c0,&vectorParams._M_t);
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)&stack0xfffffffffffffd50;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector(&flavourFlags,__l_01,(allocator_type *)&stack0xfffffffffffffd4f);
        FVar5.m_mask = '\x01';
        uVar4 = 0x141acd;
        __l_02._M_len = 1;
        __l_02._M_array = (iterator)&stack0xfffffffffffffd4e;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)&stack0xfffffffffffffd68,__l_02,(allocator_type *)&stack0xfffffffffffffd4d);
        returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_c0;
        returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_1c8;
        returnParams_00.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = raii;
        vectorParams_01._M_t._M_impl._0_8_ = &flavourFlags;
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_header._1_7_ = 0;
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x1;
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&stack0xfffffffffffffd68;
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar4;
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ =
             in_stack_fffffffffffffd48;
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = FVar5.m_mask;
        vectorParams_01._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
             in_stack_fffffffffffffd4f;
        generateCommandSetInclusive
                  (__return_storage_ptr__,this,name,commandData,initialSkipCount,local_2ac._0_1_,
                   returnParams_00,vectorParams_01,true,
                   (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    *)name,SUB81(initialSkipCount,0),(bool)in_stack_fffffffffffffd68.m_mask,
                   in_stack_fffffffffffffd70);
        std::
        _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::~_Vector_base((_Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                         *)&stack0xfffffffffffffd68);
        std::
        _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::~_Vector_base(&flavourFlags.
                         super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                       );
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::~_Rb_tree(&local_c0);
        this_00 = &local_1c8;
        goto LAB_00141d1d;
      }
    }
    else {
      bVar2 = isStructureChainAnchor
                        (this,&(params->
                               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                               )._M_impl.super__Vector_impl_data._M_start[returnParam].type.type);
      if (bVar2) {
        if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          local_280 = returnParam;
          __l_03._M_len = 1;
          __l_03._M_array = &local_280;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1e0,__l_03,
                     (allocator_type *)&stack0xfffffffffffffd4f);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::_Rb_tree(&local_f0,&vectorParams._M_t);
          local_2ae = 0x201;
          __l_04._M_len = 2;
          __l_04._M_array = (iterator)&local_2ae;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector(&flavourFlags,__l_04,(allocator_type *)&stack0xfffffffffffffd4e);
          uVar4 = 0x141bd8;
          __l_05._M_len = 2;
          __l_05._M_array = (iterator)&stack0xfffffffffffffd50;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)&stack0xfffffffffffffd68,__l_05,(allocator_type *)&stack0xfffffffffffffd4d);
          returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&local_f0;
          returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_1e0;
          returnParams_01.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&stack0xfffffffffffffd68;
          vectorParams_02._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flavourFlags));
          vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar4;
          vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ =
               in_stack_fffffffffffffd48;
          vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ =
               in_stack_fffffffffffffd4e.m_mask;
          vectorParams_02._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
               in_stack_fffffffffffffd4f;
          generateCommandSetInclusive
                    (__return_storage_ptr__,this,name,commandData,initialSkipCount,local_2ac._0_1_,
                     returnParams_01,vectorParams_02,true,
                     (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      *)name,SUB81(initialSkipCount,0),(bool)in_stack_fffffffffffffd68.m_mask,
                     in_stack_fffffffffffffd70);
          std::
          _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ::~_Vector_base((_Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                           *)&stack0xfffffffffffffd68);
          std::
          _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ::~_Vector_base(&flavourFlags.
                           super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                         );
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::~_Rb_tree(&local_f0);
          this_00 = &local_1e0;
          goto LAB_00141d1d;
        }
      }
      else if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
        if (*(size_t *)(vectorParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1) ==
            returnParam) {
          local_280 = returnParam;
          __l_12._M_len = 1;
          __l_12._M_array = &local_280;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_210,__l_12,
                     (allocator_type *)&stack0xfffffffffffffd50);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::_Rb_tree(&local_150,&vectorParams._M_t);
          local_2ae = 0x1001;
          __l_13._M_len = 2;
          __l_13._M_array = (iterator)&local_2ae;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector(&flavourFlags,__l_13,(allocator_type *)&stack0xfffffffffffffd4f);
          FVar5.m_mask = '\x01';
          uVar4 = 0x141e95;
          __l_14._M_len = 1;
          __l_14._M_array = (iterator)&stack0xfffffffffffffd4e;
          std::
          vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>::
          vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)&stack0xfffffffffffffd68,__l_14,(allocator_type *)&stack0xfffffffffffffd4d);
          returnParams_04.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)&local_150;
          returnParams_04.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&local_210;
          returnParams_04.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          vectorParams_05._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)&stack0xfffffffffffffd68;
          vectorParams_05._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flavourFlags));
          vectorParams_05._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar4;
          vectorParams_05._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ =
               in_stack_fffffffffffffd48;
          vectorParams_05._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = FVar5.m_mask;
          vectorParams_05._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
               in_stack_fffffffffffffd4f;
          generateCommandSetInclusive
                    (__return_storage_ptr__,this,name,commandData,initialSkipCount,local_2ac._0_1_,
                     returnParams_04,vectorParams_05,(bool)in_stack_fffffffffffffd50.m_mask,
                     (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                      *)name,SUB81(initialSkipCount,0),(bool)in_stack_fffffffffffffd68.m_mask,
                     in_stack_fffffffffffffd70);
          std::
          _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ::~_Vector_base((_Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                           *)&stack0xfffffffffffffd68);
          std::
          _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
          ::~_Vector_base(&flavourFlags.
                           super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                         );
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          ::~_Rb_tree(&local_150);
          this_00 = &local_210;
          goto LAB_00141d1d;
        }
        bVar2 = isHandleType(this,&(params->
                                   super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                   )._M_impl.super__Vector_impl_data._M_start
                                   [*(size_t *)
                                     (vectorParams._M_t._M_impl.super__Rb_tree_header._M_header.
                                      _M_left + 1)].type.type);
        if (!bVar2) {
          bVar2 = isStructureChainAnchor
                            (this,&(params->
                                   super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                   )._M_impl.super__Vector_impl_data._M_start
                                   [*(long *)(vectorParams._M_t._M_impl.super__Rb_tree_header.
                                              _M_header._M_left + 1)].type.type);
          if (!bVar2) {
            bVar2 = std::operator==(&(params->
                                     super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                                     )._M_impl.super__Vector_impl_data._M_start
                                     [*(long *)(vectorParams._M_t._M_impl.super__Rb_tree_header.
                                                _M_header._M_left + 1)].type.type,"void");
            if (!bVar2) {
              pPVar1 = (params->
                       super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              bVar2 = isLenByStructMember(this,&pPVar1[*(long *)(vectorParams._M_t._M_impl.
                                                                 super__Rb_tree_header._M_header.
                                                                 _M_left + 1)].lenExpression,
                                          pPVar1 + (long)vectorParams._M_t._M_impl.
                                                         super__Rb_tree_header._M_header._M_left[1].
                                                         _M_parent);
              if (bVar2) {
                local_280 = returnParam;
                __l_15._M_len = 1;
                __l_15._M_array = &local_280;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_228,
                           __l_15,(allocator_type *)&local_2ae);
                std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                ::_Rb_tree(&local_180,&vectorParams._M_t);
                __l_16._M_len = 1;
                __l_16._M_array = (iterator)&stack0xfffffffffffffd50;
                std::
                vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                ::vector(&flavourFlags,__l_16,(allocator_type *)&stack0xfffffffffffffd4f);
                FVar5.m_mask = '\x01';
                uVar4 = 0x14201c;
                __l_17._M_len = 1;
                __l_17._M_array = (iterator)&stack0xfffffffffffffd4e;
                std::
                vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                ::vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                          *)&stack0xfffffffffffffd68,__l_17,
                         (allocator_type *)&stack0xfffffffffffffd4d);
                returnParams_05.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)&local_180;
                returnParams_05.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)&local_228;
                returnParams_05.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                vectorParams_06._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     (_Base_ptr)&stack0xfffffffffffffd68;
                vectorParams_06._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flavourFlags));
                vectorParams_06._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     (_Base_ptr)uVar4;
                vectorParams_06._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ =
                     in_stack_fffffffffffffd48;
                vectorParams_06._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ =
                     FVar5.m_mask;
                vectorParams_06._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
                     in_stack_fffffffffffffd4f;
                generateCommandSetInclusive
                          (__return_storage_ptr__,this,name,commandData,initialSkipCount,
                           local_2ac._0_1_,returnParams_05,vectorParams_06,true,
                           (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                            *)name,SUB81(initialSkipCount,0),(bool)in_stack_fffffffffffffd68.m_mask,
                           in_stack_fffffffffffffd70);
                std::
                _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                ::~_Vector_base((_Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                                 *)&stack0xfffffffffffffd68);
                std::
                _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                ::~_Vector_base(&flavourFlags.
                                 super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                               );
                std::
                _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
                ::~_Rb_tree(&local_180);
                this_00 = &local_228;
                goto LAB_00141d1d;
              }
            }
          }
        }
      }
      else if (vectorParams._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        local_280 = returnParam;
        __l_09._M_len = 1;
        __l_09._M_array = &local_280;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1f8,__l_09,
                   (allocator_type *)&local_2ae);
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::_Rb_tree(&local_120,&vectorParams._M_t);
        __l_10._M_len = 1;
        __l_10._M_array = (iterator)&stack0xfffffffffffffd50;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector(&flavourFlags,__l_10,(allocator_type *)&stack0xfffffffffffffd4f);
        FVar5.m_mask = '\x01';
        uVar4 = 0x141da6;
        __l_11._M_len = 1;
        __l_11._M_array = (iterator)&stack0xfffffffffffffd4e;
        std::vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::vector((vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                  *)&stack0xfffffffffffffd68,__l_11,(allocator_type *)&stack0xfffffffffffffd4d);
        returnParams_03.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&local_120;
        returnParams_03.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_1f8;
        returnParams_03.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vectorParams_04._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)&stack0xfffffffffffffd68;
        vectorParams_04._M_t._M_impl._0_24_ = ZEXT924(CONCAT18(raii,&flavourFlags));
        vectorParams_04._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)uVar4;
        vectorParams_04._M_t._M_impl.super__Rb_tree_header._M_node_count._0_6_ =
             in_stack_fffffffffffffd48;
        vectorParams_04._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = FVar5.m_mask;
        vectorParams_04._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
             in_stack_fffffffffffffd4f;
        generateCommandSetInclusive
                  (__return_storage_ptr__,this,name,commandData,initialSkipCount,local_2ac._0_1_,
                   returnParams_03,vectorParams_04,true,
                   (vector<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                    *)name,SUB81(initialSkipCount,0),(bool)in_stack_fffffffffffffd68.m_mask,
                   in_stack_fffffffffffffd70);
        std::
        _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::~_Vector_base((_Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                         *)&stack0xfffffffffffffd68);
        std::
        _Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
        ::~_Vector_base(&flavourFlags.
                         super__Vector_base<Flags<CommandFlavourFlagBits>,_std::allocator<Flags<CommandFlavourFlagBits>_>_>
                       );
        std::
        _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
        ::~_Rb_tree(&local_120);
        this_00 = &local_1f8;
LAB_00141d1d:
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(this_00);
        goto LAB_0014209f;
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&flavourFlags);
LAB_0014209f:
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>,_std::_Select1st<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
  ::~_Rb_tree(&vectorParams._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateCommandVoid1Return(
  std::string const & name, CommandData const & commandData, size_t initialSkipCount, bool definition, size_t returnParam, bool raii ) const
{
  std::map<size_t, VectorParamData> vectorParams = determineVectorParams( commandData.params );
  if ( ( commandData.params[returnParam].type.type == "void" ) )
  {
    switch ( vectorParams.size() )
    {
      case 0:
        return generateCommandSetInclusive( name,
                                            commandData,
                                            initialSkipCount,
                                            definition,
                                            { returnParam },
                                            vectorParams,
                                            false,
                                            { CommandFlavourFlagBits::enhanced },
                                            raii,
                                            false,
                                            { CommandFlavourFlagBits::enhanced } );
      case 1:
        if ( returnParam == vectorParams.begin()->first )
        {
          if ( name == stripPluralS( name ) )
          {
            std::vector<CommandFlavourFlags> flavourFlags;
            if ( name == "vkGetDescriptorEXT" )
            {
              // special handling for this function: do not return the void*, but keep its argument as it is
              flavourFlags.push_back( CommandFlavourFlagBits::noReturn | CommandFlavourFlagBits::keepVoidPtr );
            }
            flavourFlags.push_back( CommandFlavourFlagBits::singular );
            return generateCommandSetInclusive(
              name, commandData, initialSkipCount, definition, { returnParam }, vectorParams, false, flavourFlags, raii, false, flavourFlags );
          }
        }
        break;
      default: break;
    }
  }
  else if ( isHandleType( commandData.params[returnParam].type.type ) )
  {
    if ( vectorParams.empty() )
    {
      return generateCommandSetInclusive( name,
                                          commandData,
                                          initialSkipCount,
                                          definition,
                                          { returnParam },
                                          vectorParams,
                                          false,
                                          { CommandFlavourFlagBits::enhanced },
                                          raii,
                                          true,
                                          { CommandFlavourFlagBits::enhanced } );
    }
  }
  else if ( isStructureChainAnchor( commandData.params[returnParam].type.type ) )
  {
    if ( vectorParams.empty() )
    {
      return generateCommandSetInclusive( name,
                                          commandData,
                                          initialSkipCount,
                                          definition,
                                          { returnParam },
                                          vectorParams,
                                          false,
                                          { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::chained },
                                          raii,
                                          false,
                                          { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::chained } );
    }
  }
  else
  {
    switch ( vectorParams.size() )
    {
      case 0:
        return generateCommandSetInclusive( name,
                                            commandData,
                                            initialSkipCount,
                                            definition,
                                            { returnParam },
                                            vectorParams,
                                            false,
                                            { CommandFlavourFlagBits::enhanced },
                                            raii,
                                            false,
                                            { CommandFlavourFlagBits::enhanced } );
      case 1:
        if ( returnParam == vectorParams.begin()->first )
        {
          // you get a vector of stuff, with the size being one of the parameters
          return generateCommandSetInclusive( name,
                                              commandData,
                                              initialSkipCount,
                                              definition,
                                              { returnParam },
                                              vectorParams,
                                              false,
                                              { CommandFlavourFlagBits::enhanced, CommandFlavourFlagBits::withAllocator },
                                              raii,
                                              false,
                                              { CommandFlavourFlagBits::enhanced } );
        }
        else
        {
          if ( !isHandleType( commandData.params[vectorParams.begin()->first].type.type ) &&
               !isStructureChainAnchor( commandData.params[vectorParams.begin()->first].type.type ) &&
               ( commandData.params[vectorParams.begin()->first].type.type != "void" ) )
          {
            if ( isLenByStructMember( commandData.params[vectorParams.begin()->first].lenExpression,
                                      commandData.params[vectorParams.begin()->second.lenParam] ) )
            {
              return generateCommandSetInclusive( name,
                                                  commandData,
                                                  initialSkipCount,
                                                  definition,
                                                  { returnParam },
                                                  vectorParams,
                                                  false,
                                                  { CommandFlavourFlagBits::enhanced },
                                                  raii,
                                                  false,
                                                  { CommandFlavourFlagBits::enhanced } );
            }
          }
        }
        break;
      default: break;
    }
  }
  return "";
}